

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O1

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::plus_equal_column(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                    *this,Column *target,A_ds_type *other,Arith_element w)

{
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
  *this_00;
  node_ptr plVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  Element EVar4;
  node_ptr next;
  pointer pPVar5;
  Cell *tmp_cell_ptr;
  Field_Zp *this_01;
  pointer ppVar6;
  iterator tmp_it;
  node_ptr plVar7;
  node_ptr plVar8;
  Arith_element local_84;
  Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
  *local_80;
  Persistent_cohomology_cell<unsigned_int,_int> local_78;
  node_ptr local_40;
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
  *local_38;
  
  local_40 = (node_ptr)&target->col_;
  plVar7 = (target->col_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  ppVar6 = (other->
           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_84 = w;
  local_80 = this;
  if ((plVar7 != local_40) &&
     (ppVar6 != (other->
                super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish)) {
    local_38 = (Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                *)&this->cell_pool_;
    do {
      plVar1 = plVar7 + -1;
      if (*(uint *)&plVar7[1].next_ < ppVar6->first) {
        plVar8 = plVar7->next_;
      }
      else if (ppVar6->first < *(uint *)&plVar7[1].next_) {
        local_78.key_ = ppVar6->first;
        local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
             (node_ptr)0x0;
        local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
             (node_ptr)0x0;
        local_78.coefficient_ = 0;
        local_78.self_col_ = target;
        pPVar5 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                 ::
                 construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                           (local_38,&local_78);
        if (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ !=
            (node_ptr)0x0) {
          (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_)->
          next_ = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_
          ;
          (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_)->
          prev_ = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_
          ;
          local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
               (node_ptr)0x0;
          local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
               (node_ptr)0x0;
        }
        EVar4 = Field_Zp::plus_times_equal
                          (&this->coeff_field_,&pPVar5->coefficient_,&ppVar6->second,&local_84);
        pPVar5->coefficient_ = EVar4;
        plVar1 = plVar7->prev_;
        (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.prev_ = plVar1
        ;
        (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.next_ = plVar7
        ;
        plVar7->prev_ = (node_ptr)&pPVar5->super_base_hook_cam_v;
        plVar1->next_ = (node_ptr)&pPVar5->super_base_hook_cam_v;
        ppVar6 = ppVar6 + 1;
        plVar8 = plVar7;
      }
      else {
        EVar4 = Field_Zp::plus_times_equal
                          (&this->coeff_field_,(Element *)((long)&plVar7[1].next_ + 4),
                           &ppVar6->second,&local_84);
        *(Element *)((long)&plVar7[1].next_ + 4) = EVar4;
        ppVar6 = ppVar6 + 1;
        plVar8 = plVar7->next_;
        if (EVar4 == 0) {
          plVar2 = plVar7->prev_;
          plVar2->next_ = plVar8;
          plVar8->prev_ = plVar2;
          plVar2 = plVar7[-1].next_;
          if (plVar2 != (node_ptr)0x0) {
            plVar3 = plVar7[-1].prev_;
            plVar3->next_ = plVar2;
            plVar2->prev_ = plVar3;
            plVar1->next_ = (node_ptr)0x0;
            plVar7[-1].prev_ = (node_ptr)0x0;
          }
          plVar1->next_ =
               (node_ptr)
               (local_80->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.
               super_simple_segregated_storage<unsigned_long>.first;
          (local_80->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.
          super_simple_segregated_storage<unsigned_long>.first = plVar1;
        }
      }
    } while ((plVar8 != local_40) &&
            (plVar7 = plVar8,
            ppVar6 != (other->
                      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish));
  }
  if (ppVar6 != (other->
                super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &local_80->cell_pool_;
    this_01 = &local_80->coeff_field_;
    do {
      local_78.key_ = ppVar6->first;
      local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)0x0;
      local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
           (node_ptr)0x0;
      local_78.coefficient_ = 0;
      local_78.self_col_ = target;
      pPVar5 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
               ::
               construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                         ((Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                           *)this_00,&local_78);
      if (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_)->next_
             = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_;
        (local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_)->prev_
             = local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_;
        local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
             (node_ptr)0x0;
        local_78.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
             (node_ptr)0x0;
      }
      EVar4 = Field_Zp::plus_times_equal(this_01,&pPVar5->coefficient_,&ppVar6->second,&local_84);
      pPVar5->coefficient_ = EVar4;
      plVar7 = (target->col_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
      (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.prev_ = plVar7;
      (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.next_ = local_40
      ;
      (target->col_).super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           (node_ptr)&pPVar5->super_base_hook_cam_v;
      plVar7->next_ = (node_ptr)&pPVar5->super_base_hook_cam_v;
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != (other->
                       super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void plus_equal_column(Column & target, A_ds_type const& other  // value_type is pair<Simplex_key,Arith_element>
                         , Arith_element w) {
    auto target_it = target.col_.begin();
    auto other_it = other.begin();
    while (target_it != target.col_.end() && other_it != other.end()) {
      if (target_it->key_ < other_it->first) {
        ++target_it;
      } else {
        if (target_it->key_ > other_it->first) {
          Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first   // key
              , coeff_field_.additive_identity(), &target));

          cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);

          target.col_.insert(target_it, *cell_tmp);

          ++other_it;
        } else {  // it1->key == it2->key
          // target_it->coefficient_ <- target_it->coefficient_ + other_it->second * w
          target_it->coefficient_ = coeff_field_.plus_times_equal(target_it->coefficient_, other_it->second, w);
          if (target_it->coefficient_ == coeff_field_.additive_identity()) {
            auto tmp_it = target_it;
            ++target_it;
            ++other_it;   // iterators remain valid
            Cell * tmp_cell_ptr = &(*tmp_it);
            target.col_.erase(tmp_it);  // removed from column

            cell_pool_.destroy(tmp_cell_ptr);  // delete from memory
          } else {
            ++target_it;
            ++other_it;
          }
        }
      }
    }
    while (other_it != other.end()) {
      Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first, coeff_field_.additive_identity(), &target));
      cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);
      target.col_.insert(target.col_.end(), *cell_tmp);

      ++other_it;
    }
  }